

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void check_perm(char *what,int n,int *perm)

{
  int iVar1;
  ulong uVar2;
  int *__s;
  size_t __size;
  
  uVar2 = (ulong)(uint)n;
  __s = int32Malloc(n);
  if (0 < n) {
    __size = 0;
    memset(__s,0,uVar2 * 4);
    do {
      iVar1 = perm[__size];
      if ((n <= iVar1) || (__s[iVar1] == 1)) {
        check_perm_cold_1();
        malloc(__size);
        return;
      }
      __s[iVar1] = 1;
      __size = __size + 1;
    } while (uVar2 != __size);
  }
  superlu_free(__s);
  printf("check_perm: %s: n %d\n",what,uVar2);
  return;
}

Assistant:

void check_perm(const char *what, int n, const int *perm)
{
    register int i;
    int          *marker;
    /*marker = (int *) calloc(n, sizeof(int));*/
    marker = int32Malloc(n);
    for (i = 0; i < n; ++i) marker[i] = 0;

    for (i = 0; i < n; ++i) {
	if ( marker[perm[i]] == 1 || perm[i] >= n ) {
	    printf("%s: Not a valid PERM[%d] = %d\n", what, i, perm[i]);
	    ABORT("check_perm");
	} else {
	    marker[perm[i]] = 1;
	}
    }

    SUPERLU_FREE(marker);
    printf("check_perm: %s: n %d\n", what, n);
}